

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void is_suite::is_string(void)

{
  undefined1 local_91;
  undefined1 local_90 [2];
  undefined1 local_8e;
  undefined1 local_8d [2];
  undefined1 local_8b;
  undefined1 local_8a [2];
  undefined1 local_88;
  undefined1 local_87 [2];
  undefined1 local_85;
  undefined1 local_84 [2];
  undefined1 local_82;
  undefined1 local_81 [2];
  undefined1 local_7f;
  undefined1 local_7e [2];
  undefined1 local_7c;
  undefined1 local_7b [2];
  undefined1 local_79;
  undefined1 local_78 [2];
  undefined1 local_76;
  undefined1 local_75 [2];
  undefined1 local_73;
  undefined1 local_72 [2];
  undefined1 local_70;
  undefined1 local_6f [2];
  undefined1 local_6d;
  undefined1 local_6c [2];
  undefined1 local_6a;
  undefined1 local_69 [2];
  undefined1 local_67;
  undefined1 local_66 [2];
  undefined1 local_64;
  undefined1 local_63 [2];
  undefined1 local_61;
  undefined1 local_60 [2];
  undefined1 local_5e;
  undefined1 local_5d [2];
  undefined1 local_5b;
  undefined1 local_5a [2];
  undefined1 local_58;
  undefined1 local_57 [2];
  undefined1 local_55;
  undefined1 local_54 [2];
  undefined1 local_52;
  undefined1 local_51 [2];
  undefined1 local_4f;
  undefined1 local_4e [19];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,"alpha");
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x48e,"void is_suite::is_string()",local_3a,&local_3b);
  local_4e[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::string>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_4f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<std::string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x48f,"void is_suite::is_string()",local_4e,&local_4f);
  local_51[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::string>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_52 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<variable::string_type>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x490,"void is_suite::is_string()",local_51,&local_52);
  local_54[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::string&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_55 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<variable::string_type&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x491,"void is_suite::is_string()",local_54,&local_55);
  local_57[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::string_const>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_58 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const variable::string_type>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x492,"void is_suite::is_string()",local_57,&local_58);
  local_5a[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                is<std::__cxx11::string_const&>((basic_variable<std::allocator<char>> *)local_38);
  local_5b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const variable::string_type&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x493,"void is_suite::is_string()",local_5a,&local_5b);
  local_5d[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                is<std::__cxx11::string_volatile>((basic_variable<std::allocator<char>> *)local_38);
  local_5e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<volatile variable::string_type>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x494,"void is_suite::is_string()",local_5d,&local_5e);
  local_60[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                is<std::__cxx11::string_volatile&>((basic_variable<std::allocator<char>> *)local_38)
  ;
  local_61 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<volatile variable::string_type&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x495,"void is_suite::is_string()",local_60,&local_61);
  local_63[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_64 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<wstring>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x497,"void is_suite::is_string()",local_63,&local_64);
  local_66[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::wstring>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_67 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<std::wstring>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x498,"void is_suite::is_string()",local_66,&local_67);
  local_69[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::wstring>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_6a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<variable::wstring_type>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x499,"void is_suite::is_string()",local_69,&local_6a);
  local_6c[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u16string>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_6d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u16string>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x49b,"void is_suite::is_string()",local_6c,&local_6d);
  local_6f[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::u16string>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_70 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<std::u16string>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x49c,"void is_suite::is_string()",local_6f,&local_70);
  local_72[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::u16string>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_73 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<variable::u16string_type>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x49d,"void is_suite::is_string()",local_72,&local_73);
  local_75[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_76 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u32string>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x49f,"void is_suite::is_string()",local_75,&local_76);
  local_78[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::u32string>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_79 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<std::u32string>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a0,"void is_suite::is_string()",local_78,&local_79);
  local_7b[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<std::__cxx11::u32string>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_7c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<variable::u32string_type>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a1,"void is_suite::is_string()",local_7b,&local_7c);
  local_7e[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::string>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_7f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<variable::string_type>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a3,"void is_suite::is_string()",local_7e,&local_7f);
  local_81[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::string&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_82 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<variable::string_type&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a4,"void is_suite::is_string()",local_81,&local_82);
  local_84[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                same<std::__cxx11::string_const>((basic_variable<std::allocator<char>> *)local_38);
  local_85 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<const variable::string_type>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a5,"void is_suite::is_string()",local_84,&local_85);
  local_87[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                same<std::__cxx11::string_const&>((basic_variable<std::allocator<char>> *)local_38);
  local_88 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<const variable::string_type&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a6,"void is_suite::is_string()",local_87,&local_88);
  local_8a[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                same<std::__cxx11::string_volatile>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_8b = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<volatile variable::string_type>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a7,"void is_suite::is_string()",local_8a,&local_8b);
  local_8d[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                same<std::__cxx11::string_volatile&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_8e = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<volatile variable::string_type&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4a8,"void is_suite::is_string()",local_8d,&local_8e);
  local_90[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::wstring>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_91 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<variable::wstring_type>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x4aa,"void is_suite::is_string()",local_90,&local_91);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void is_string()
{
    variable data("alpha");
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<string>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<std::string>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<variable::string_type>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<variable::string_type&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const variable::string_type>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const variable::string_type&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<volatile variable::string_type>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<volatile variable::string_type&>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<wstring>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<std::wstring>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<variable::wstring_type>(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<u16string>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<std::u16string>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<variable::u16string_type>(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<u32string>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<std::u32string>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<variable::u32string_type>(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(data.same<variable::string_type>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<variable::string_type&>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<const variable::string_type>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<const variable::string_type&>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<volatile variable::string_type>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<volatile variable::string_type&>(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(data.same<variable::wstring_type>(), false);
}